

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O3

void Process::interrupt(void)

{
  code *pcVar1;
  int iVar2;
  __pid_t _Var3;
  int iVar4;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&ProcessFramework::mutex);
  if ((iVar2 == 0) ||
     (iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Process.cpp"
                            ,0x535,"pthread_mutex_lock(&ProcessFramework::mutex) == 0"), iVar2 == 0)
     ) {
    iVar2 = ProcessFramework::signaled;
    if (ProcessFramework::signaled == 0) {
      if (ProcessFramework::waitState == 1) {
        ProcessFramework::signaled = -1;
        iVar4 = pthread_cond_signal((pthread_cond_t *)&ProcessFramework::condition);
        iVar2 = ProcessFramework::signaled;
        if ((iVar4 != 0) &&
           (iVar4 = Debug::printf("%s:%u: verification failed: %s\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Process.cpp"
                                  ,0x549,"pthread_cond_signal(&ProcessFramework::condition) == 0"),
           iVar2 = ProcessFramework::signaled, iVar4 != 0)) goto LAB_0010e812;
      }
      else {
        iVar2 = -1;
        if ((ProcessFramework::waitState == 2) &&
           ((_Var3 = vfork(), iVar2 = ProcessFramework::signaled, _Var3 != -1 &&
            (iVar2 = _Var3, _Var3 == 0)))) {
          _exit(0);
        }
      }
    }
    ProcessFramework::signaled = iVar2;
    iVar2 = pthread_mutex_unlock((pthread_mutex_t *)&ProcessFramework::mutex);
    if ((iVar2 == 0) ||
       (iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Process.cpp"
                              ,0x54e,"pthread_mutex_unlock(&ProcessFramework::mutex) == 0"),
       iVar2 == 0)) {
      return;
    }
  }
LAB_0010e812:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void Process::interrupt()
{
#ifdef _WIN32
  EnterCriticalSection(&ProcessFramework::criticalSection);
  if(ProcessFramework::hInterruptEvent == INVALID_HANDLE_VALUE)
    ProcessFramework::hInterruptEvent = CreateEvent(NULL, FALSE, FALSE, NULL);
   SetEvent(ProcessFramework::hInterruptEvent);
  LeaveCriticalSection(&ProcessFramework::criticalSection);
#else
  VERIFY(pthread_mutex_lock(&ProcessFramework::mutex) == 0);
  if(!ProcessFramework::signaled)
    switch(ProcessFramework::waitState)
    {
    case 2:
      {
        pid_t pid = vfork();
        switch(pid)
        {
        case 0:
          _exit(0);
        case -1:
          break;
        default:
          ProcessFramework::signaled = pid;
        }
      }
      break;
    case 1:
      ProcessFramework::signaled = -1;
      VERIFY(pthread_cond_signal(&ProcessFramework::condition) == 0);
      break;
    default:
      ProcessFramework::signaled = -1;
    }
  VERIFY(pthread_mutex_unlock(&ProcessFramework::mutex) == 0);
#endif
}